

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastTable(Gia_Man_t *pNew,word *pTable,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  uint *pTruth;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  Vec_Int_t vLeaves;
  
  p = Vec_IntAlloc(0);
  iVar1 = 1 << ((byte)nFans - 6 & 0x1f);
  if (nFans < 7) {
    iVar1 = 1;
  }
  vLeaves.nCap = nFans;
  vLeaves.nSize = nFans;
  vLeaves.pArray = pFans;
  pTruth = (uint *)malloc((long)iVar1 << 3);
  iVar3 = 0;
  bVar4 = (byte)nFans & 0x1f;
  uVar7 = 1 << bVar4;
  vRes->nSize = 0;
  iVar5 = 3;
  if (3 < (uint)nFans) {
    iVar5 = nFans;
  }
  iVar10 = 0;
  if (0 < nFans) {
    iVar10 = nFans;
  }
  if (1 << bVar4 < 1) {
    uVar7 = 0;
  }
  if (nOuts < 1) {
    nOuts = 0;
  }
  do {
    if (iVar3 == nOuts) {
      Vec_IntFree(p);
      free(pTruth);
      return;
    }
    uVar8 = 0;
    memset(pTruth,0,(long)iVar1 << 3);
    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      iVar11 = (int)uVar8;
      iVar9 = iVar10;
      while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
        if ((pTable[(int)uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
          *(ulong *)(pTruth + (ulong)(uVar6 >> 6) * 2) =
               *(ulong *)(pTruth + (ulong)(uVar6 >> 6) * 2) | 1L << ((byte)uVar6 & 0x3f);
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      uVar8 = (ulong)(uint)(iVar11 + nFans);
    }
    if (nFans < 6) {
      if (nFans < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      uVar2 = (uint)*(undefined8 *)pTruth;
      uVar6 = -(uVar2 & 1);
      if (nFans != 0) {
        uVar6 = uVar2;
      }
      uVar6 = (uVar6 & 3) * 5;
      if (1 < (uint)nFans) {
        uVar6 = uVar2;
      }
      bVar4 = ((byte)uVar6 & 0xf) * '\x11';
      if (2 < (uint)nFans) {
        bVar4 = (byte)*(undefined8 *)pTruth;
      }
      uVar6 = (uint)bVar4 * 0x101;
      if (3 < (uint)nFans) {
        uVar6 = uVar2;
      }
      uVar2 = (uVar6 & 0xffff) * 0x10001;
      if (1 < iVar5 - 3U) {
        uVar2 = uVar6;
      }
      *(ulong *)pTruth = (ulong)uVar2 * 0x100000001;
    }
    iVar9 = Kit_TruthToGia(pNew,pTruth,nFans,p,&vLeaves,1);
    Vec_IntPush(vRes,iVar9);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Cba_BlastTable( Gia_Man_t * pNew, word * pTable, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    word * pTruth = ABC_ALLOC( word, Abc_TtWordNum(nFans) );
    int o, i, m, iLit, nMints = (1 << nFans);
    Vec_IntClear( vRes );
    for ( o = 0; o < nOuts; o++ )
    {
        // derive truth table
        memset( pTruth, 0, sizeof(word) * Abc_TtWordNum(nFans) );
        for ( m = 0; m < nMints; m++ )
            for ( i = 0; i < nFans; i++ )
                if ( Abc_TtGetBit( pTable, m * nFans + i ) )
                    Abc_TtSetBit( pTruth, m );
        // implement truth table
        if ( nFans < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], nFans );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, nFans, vMemory, &vLeaves, 1 );
        Vec_IntPush( vRes, iLit );
    }
    Vec_IntFree( vMemory );
    ABC_FREE( pTruth );
}